

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O2

int Curl_llist_insert_next(curl_llist *list,curl_llist_element *e,void *p)

{
  size_t sVar1;
  int iVar2;
  curl_llist_element *pcVar3;
  curl_llist *pcVar4;
  curl_llist *pcVar5;
  
  pcVar3 = (curl_llist_element *)(*Curl_cmalloc)(0x18);
  if (pcVar3 == (curl_llist_element *)0x0) {
    iVar2 = 0;
  }
  else {
    pcVar3->ptr = p;
    sVar1 = list->size;
    if (sVar1 == 0) {
      list->head = pcVar3;
      pcVar4 = (curl_llist *)&list->tail;
      pcVar3->prev = (curl_llist_element *)0x0;
      pcVar3->next = (curl_llist_element *)0x0;
    }
    else {
      pcVar4 = (curl_llist *)&e->next;
      pcVar5 = pcVar4;
      if (e == (curl_llist_element *)0x0) {
        pcVar5 = list;
      }
      pcVar3->next = pcVar5->head;
      pcVar3->prev = e;
      if (e == (curl_llist_element *)0x0) {
        list->head->prev = pcVar3;
        pcVar4 = list;
      }
      else {
        pcVar5 = *(curl_llist **)pcVar4;
        if (*(curl_llist **)pcVar4 == (curl_llist *)0x0) {
          pcVar5 = list;
        }
        pcVar5->tail = pcVar3;
      }
    }
    pcVar4->head = pcVar3;
    list->size = sVar1 + 1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
Curl_llist_insert_next(struct curl_llist *list, struct curl_llist_element *e,
                       const void *p)
{
  struct curl_llist_element *ne = malloc(sizeof(struct curl_llist_element));
  if(!ne)
    return 0;

  ne->ptr = (void *) p;
  if(list->size == 0) {
    list->head = ne;
    list->head->prev = NULL;
    list->head->next = NULL;
    list->tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->next = e?e->next:list->head;
    ne->prev = e;
    if(!e) {
      list->head->prev = ne;
      list->head = ne;
    }
    else if(e->next) {
      e->next->prev = ne;
    }
    else {
      list->tail = ne;
    }
    if(e)
      e->next = ne;
  }

  ++list->size;

  return 1;
}